

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_function_info.cpp
# Opt level: O3

void __thiscall
duckdb::CreateTableFunctionInfo::CreateTableFunctionInfo
          (CreateTableFunctionInfo *this,TableFunction *function)

{
  pointer pcVar1;
  __alloc_node_gen_t __alloc_node_gen;
  string local_228;
  string local_208;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
  local_1e8;
  undefined1 local_1e0 [144];
  __buckets_ptr local_150;
  size_type local_148;
  __node_base local_140;
  size_type local_138;
  _Prime_rehash_policy local_130;
  __node_base_ptr local_120;
  undefined1 local_118 [216];
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  TableFunctionInitialization local_30;
  
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"main","");
  CreateFunctionInfo::CreateFunctionInfo
            (&this->super_CreateFunctionInfo,TABLE_FUNCTION_ENTRY,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  (this->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTableFunctionInfo_01981360;
  pcVar1 = (function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name.
           _M_dataplus._M_p;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,pcVar1,
             pcVar1 + (function->super_SimpleNamedParameterFunction).super_SimpleFunction.
                      super_Function.name._M_string_length);
  TableFunctionSet::TableFunctionSet(&this->functions,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  ::std::__cxx11::string::_M_assign((string *)&(this->super_CreateFunctionInfo).name);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_1e0,(SimpleFunction *)function);
  local_1e0._0_8_ = &PTR__SimpleNamedParameterFunction_01963d08;
  local_1e8._M_h = (__hashtable_alloc *)&local_150;
  local_150 = (__buckets_ptr)0x0;
  local_148 = (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_bucket_count;
  local_140._M_nxt = (_Hash_node_base *)0x0;
  local_138 = (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_element_count;
  local_130._M_max_load_factor =
       (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_130._4_4_ =
       *(undefined4 *)
        &(function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
         field_0x4;
  local_130._M_next_resize =
       (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_120 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1e8._M_h,&(function->super_SimpleNamedParameterFunction).named_parameters._M_h
             ,&local_1e8);
  local_1e0._0_8_ = &PTR__TableFunction_01963be0;
  switchD_00b041bd::default(local_118,&function->bind,0xd6);
  local_40 = (function->function_info).internal.
             super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_38._M_pi =
       (function->function_info).internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (function->function_info).internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (function->function_info).internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_30 = function->global_initialization;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&(this->functions).super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_1e0);
  local_1e0._0_8_ = &PTR__TableFunction_01963be0;
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_1e0);
  (this->super_CreateFunctionInfo).super_CreateInfo.internal = true;
  return;
}

Assistant:

CreateTableFunctionInfo::CreateTableFunctionInfo(TableFunction function)
    : CreateFunctionInfo(CatalogType::TABLE_FUNCTION_ENTRY), functions(function.name) {
	name = function.name;
	functions.AddFunction(std::move(function));
	internal = true;
}